

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iniparser.c
# Opt level: O1

int iniparser_getboolean(dictionary *d,char *key,int notfound)

{
  byte bVar1;
  byte *pbVar2;
  uint uVar3;
  
  pbVar2 = (byte *)iniparser_getstring(d,key,(char *)0xffffffffffffffff);
  if (pbVar2 != (byte *)0xffffffffffffffff) {
    bVar1 = *pbVar2;
    uVar3 = bVar1 - 0x30;
    if (uVar3 < 0x3f) {
      if ((0x4040000040400001U >> ((ulong)uVar3 & 0x3f) & 1) != 0) {
        return 0;
      }
      if ((0x21000000002U >> ((ulong)uVar3 & 0x3f) & 1) != 0) {
        return 1;
      }
    }
    if (bVar1 == 0x74) {
      return 1;
    }
    if (bVar1 == 0x79) {
      return 1;
    }
  }
  return notfound;
}

Assistant:

int iniparser_getboolean(const dictionary * d, const char * key, int notfound)
{
    int          ret ;
    const char * c ;

    c = iniparser_getstring(d, key, INI_INVALID_KEY);
    if (c == INI_INVALID_KEY) return notfound ;
    if (c[0] == 'y' || c[0] == 'Y' || c[0] == '1' || c[0] == 't' || c[0] == 'T') {
        ret = 1 ;
    } else if (c[0] == 'n' || c[0] == 'N' || c[0] == '0' || c[0] == 'f' || c[0] == 'F') {
        ret = 0 ;
    } else {
        ret = notfound ;
    }
    return ret;
}